

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.h
# Opt level: O2

binarydata * __thiscall
NetworkDataType::serializedata<GlobalStimulationSettings::CurrentScaling_const>
          (binarydata *__return_storage_ptr__,NetworkDataType *this,CurrentScaling *args)

{
  PortableBinaryOutputArchive archive;
  ostringstream stream;
  string local_2c0;
  PortableBinaryOutputArchive local_2a0;
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  local_2c0._M_dataplus._M_p._0_1_ =
       cereal::portable_binary_detail::is_little_endian()::test == '\x01';
  cereal::PortableBinaryOutputArchive::PortableBinaryOutputArchive
            (&local_2a0,(ostream *)local_190,(Options *)&local_2c0);
  cereal::OutputArchive<cereal::PortableBinaryOutputArchive,1u>::
  process<GlobalStimulationSettings::CurrentScaling_const&>
            ((OutputArchive<cereal::PortableBinaryOutputArchive,1u> *)
             local_2a0.super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>.self,
             (CurrentScaling *)this);
  std::__cxx11::stringbuf::str();
  binarydata::binarydata(__return_storage_ptr__,&local_2c0);
  std::__cxx11::string::~string((string *)&local_2c0);
  cereal::OutputArchive<cereal::PortableBinaryOutputArchive,_1U>::~OutputArchive
            (&local_2a0.super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

static binarydata serializedata(T & ... args){
        std::ostringstream stream;
        cereal::PortableBinaryOutputArchive archive(stream);
        archive(args...);
        return binarydata(stream.str());
    }